

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O0

int accept_header(flatcc_json_printer_t *ctx,void *buf,size_t bufsiz,char *fid)

{
  flatbuffers_thash_t fVar1;
  flatbuffers_thash_t fVar2;
  flatbuffers_thash_t id2;
  flatbuffers_thash_t id;
  char *fid_local;
  size_t bufsiz_local;
  void *buf_local;
  flatcc_json_printer_t *ctx_local;
  
  if ((buf == (void *)0x0) || (bufsiz < 8)) {
    flatcc_json_printer_set_error(ctx,1);
    __assert_fail("0 && \"buffer header too small\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                  ,0x4e6,
                  "int accept_header(flatcc_json_printer_t *, const void *, size_t, const char *)");
  }
  if (fid != (char *)0x0) {
    fVar1 = flatbuffers_type_hash_from_string(fid);
    fVar2 = __flatbuffers_thash_read_from_pe((void *)((long)buf + 4));
    if ((fVar1 != 0) && (fVar2 != fVar1)) {
      flatcc_json_printer_set_error(ctx,1);
      __assert_fail("0 && \"identifier mismatch\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/json_printer.c"
                    ,0x4ee,
                    "int accept_header(flatcc_json_printer_t *, const void *, size_t, const char *)"
                   );
    }
  }
  return 1;
}

Assistant:

static int accept_header(flatcc_json_printer_t * ctx,
        const void *buf, size_t bufsiz, const char *fid)
{
    flatbuffers_thash_t id, id2 = 0;

    if (buf == 0 || bufsiz < offset_size + FLATBUFFERS_IDENTIFIER_SIZE) {
        RAISE_ERROR(bad_input);
        FLATCC_ASSERT(0 && "buffer header too small");
        return 0;
    }
    if (fid != 0) {
        id2 = flatbuffers_type_hash_from_string(fid);
        id = __flatbuffers_thash_read_from_pe((uint8_t *)buf + offset_size);
        if (!(id2 == 0 || id == id2)) {
            RAISE_ERROR(bad_input);
            FLATCC_ASSERT(0 && "identifier mismatch");
            return 0;
        }
    }
    return 1;
}